

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsConvertValueToString(JsValueRef value,JsValueRef *result)

{
  int iVar1;
  ScriptContext *pSVar2;
  ScriptContext *pSVar3;
  code *pcVar4;
  undefined1 auVar5 [8];
  bool bVar6;
  JsrtContext *pJVar7;
  RecyclableObject *pRVar8;
  JavascriptString *pJVar9;
  undefined4 *puVar10;
  JsErrorCode JVar11;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_78 [8];
  EnterScriptObject __enterScriptObject;
  TTDJsRTActionResultAutoRecorder local_48;
  AutoNestedHandledExceptionType local_2c [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType_1;
  
  if (result == (JsValueRef *)0x0) {
    return JsErrorNullArgument;
  }
  *result = (JsValueRef)0x0;
  if (((value == (JsValueRef)0x0) || ((ulong)value >> 0x30 != 0)) ||
     (bVar6 = Js::VarIsImpl<Js::JavascriptString>((RecyclableObject *)value), !bVar6)) {
    local_48.m_actionEvent = (EventLogEntry *)0x0;
    local_48.m_resultPtr = (TTDVar *)0x0;
    pJVar7 = JsrtContext::GetCurrent();
    JVar11 = JsErrorNoCurrentContext;
    if (pJVar7 != (JsrtContext *)0x0) {
      pSVar2 = (((pJVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_2c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
      auStack_b8 = (undefined1  [8])0x0;
      ___autoNestedHandledExceptionType = (void *)0x0;
      Js::EnterScriptObject::EnterScriptObject
                ((EnterScriptObject *)auStack_78,pSVar2,(ScriptEntryExitRecord *)auStack_b8,
                 unaff_retaddr,&stack0x00000000,true,true,true);
      Js::ScriptContext::OnScriptStart(pSVar2,true,true);
      Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)auStack_78);
      if (pSVar2->TTDShouldPerformRecordAction == true) {
        TTD::EventLog::RecordJsRTVarToStringConversion
                  (pSVar2->threadContext->TTDLog,&local_48,value);
      }
      if (value == (JsValueRef)0x0) {
        JVar11 = JsErrorInvalidArgument;
      }
      else {
        if ((ulong)value >> 0x30 == 0) {
          pRVar8 = Js::VarTo<Js::RecyclableObject>(value);
          pSVar3 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                   scriptContext.ptr;
          if (pSVar3 != pSVar2) {
            JVar11 = JsErrorWrongRuntime;
            if (pSVar3->threadContext != pSVar2->threadContext) goto LAB_003701cd;
            value = Js::CrossSite::MarshalVar(pSVar2,pRVar8,false);
          }
        }
        pJVar9 = Js::JavascriptConversion::ToString(value,pSVar2);
        *result = pJVar9;
        JVar11 = JsNoError;
        if (pSVar2->TTDShouldPerformRecordAction == true) {
          if (local_48.m_resultPtr == (TTDVar *)0x0) {
            TTDAbort_unrecoverable_error("Why are we calling this then???");
          }
          *local_48.m_resultPtr = pJVar9;
        }
      }
LAB_003701cd:
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)auStack_78);
      if ((JVar11 == JsErrorFatal) || (JVar11 == JsErrorNoCurrentContext)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar10 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                           ,0xcc,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar6) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_2c);
    }
    if ((ScriptEntryExitRecord *)local_48.m_actionEvent == (ScriptEntryExitRecord *)0x0) {
      return JVar11;
    }
    iVar1 = (local_48.m_actionEvent)->ResultStatus;
    auVar5 = (undefined1  [8])local_48.m_actionEvent;
    goto joined_r0x00370253;
  }
  auStack_78 = (undefined1  [8])0x0;
  __enterScriptObject.entryExitRecord = (ScriptEntryExitRecord *)0x0;
  pJVar7 = JsrtContext::GetCurrent();
  JVar11 = JsErrorNoCurrentContext;
  if (pJVar7 != (JsrtContext *)0x0) {
    pSVar2 = (((pJVar7->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)auStack_b8,
               ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    if (pSVar2->TTDShouldPerformRecordAction == true) {
      TTD::EventLog::RecordJsRTVarToStringConversion
                (pSVar2->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_78,value);
    }
    if (value < (JsValueRef)0x1000000000000) {
      pRVar8 = Js::VarTo<Js::RecyclableObject>(value);
      pSVar3 = (((((pRVar8->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar3 == pSVar2) goto LAB_0037003c;
      JVar11 = JsErrorWrongRuntime;
      if (pSVar3->threadContext == pSVar2->threadContext) {
        value = Js::CrossSite::MarshalVar(pSVar2,pRVar8,false);
        goto LAB_0037003c;
      }
    }
    else {
LAB_0037003c:
      *result = value;
      JVar11 = JsNoError;
      if (pSVar2->TTDShouldPerformRecordAction == true) {
        if (__enterScriptObject.entryExitRecord == (ScriptEntryExitRecord *)0x0) {
          TTDAbort_unrecoverable_error("Why are we calling this then???");
        }
        *(JsValueRef *)__enterScriptObject.entryExitRecord = value;
      }
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)auStack_b8);
  }
  if (auStack_78 == (undefined1  [8])0x0) {
    return JVar11;
  }
  iVar1 = *(int32 *)((long)auStack_78 + 4);
  auVar5 = auStack_78;
joined_r0x00370253:
  if (iVar1 == -1) {
    *(JsErrorCode *)&((ScriptEntryExitRecord *)auVar5)->field_0x4 = JVar11;
    return JVar11;
  }
  TTDAbort_unrecoverable_error("Hmm this got changed somewhere???");
}

Assistant:

CHAKRA_API JsConvertValueToString(_In_ JsValueRef value, _Out_ JsValueRef *result)
{
    PARAM_NOT_NULL(result);
    *result = nullptr;

    if (value != nullptr && Js::VarIs<Js::JavascriptString>(value))
    {
        return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToStringConversion, (Js::Var)value);
            VALIDATE_INCOMING_REFERENCE(value, scriptContext);

            *result = value;

            PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

            return JsNoError;
        });
    }

    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTVarToStringConversion, (Js::Var)value);
        VALIDATE_INCOMING_REFERENCE(value, scriptContext);

        *result = (JsValueRef) Js::JavascriptConversion::ToString((Js::Var)value, scriptContext);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return JsNoError;
    });
}